

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<std::filesystem::__cxx11::path>::emplaceRealloc<char_const(&)[2]>
          (SmallVectorBase<std::filesystem::__cxx11::path> *this,pointer pos,char (*args) [2])

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator ppVar4;
  long lVar5;
  pointer ppVar6;
  iterator __result;
  iterator in_RSI;
  SmallVectorBase<std::filesystem::__cxx11::path> *in_RDI;
  path *unaff_retaddr;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  path *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffb0;
  iterator __first;
  SmallVectorBase<std::filesystem::__cxx11::path> *__source;
  
  sVar1 = in_RDI->len;
  __source = in_RDI;
  sVar2 = max_size((SmallVectorBase<std::filesystem::__cxx11::path> *)0x3c3f3b);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __first = in_RSI;
  ppVar4 = begin(in_RDI);
  lVar5 = (long)in_RSI - (long)ppVar4;
  ppVar6 = (pointer)operator_new(0x3c3f9d);
  std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
            (unaff_retaddr,(char (*) [2])__source,(format)((ulong)__first >> 0x38));
  ppVar4 = end(in_RDI);
  if (__first == ppVar4) {
    __result = begin(in_RDI);
    ppVar4 = end(in_RDI);
    std::uninitialized_move<std::filesystem::__cxx11::path*,std::filesystem::__cxx11::path*>
              (__first,in_RSI,__result);
  }
  else {
    begin(in_RDI);
    std::uninitialized_move<std::filesystem::__cxx11::path*,std::filesystem::__cxx11::path*>
              (__first,in_RSI,in_stack_ffffffffffffffa0);
    ppVar4 = end(in_RDI);
    std::uninitialized_move<std::filesystem::__cxx11::path*,std::filesystem::__cxx11::path*>
              (__first,in_RSI,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)ppVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = ppVar6;
  return ppVar6 + lVar5 / 0x28;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}